

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase793::run(TestCase793 *this)

{
  word *pwVar1;
  size_t sVar2;
  word *pwVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  Reader value;
  Reader value_00;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1a8;
  OrphanBuilder local_188;
  StructBuilder local_168;
  OrphanBuilder local_138;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1a8,&local_118.super_MessageBuilder);
  local_188.capTable = (CapTableBuilder *)local_1a8.pointer;
  local_188.tag.content = (uint64_t)local_1a8.segment;
  local_188.segment = (SegmentBuilder *)local_1a8.capTable;
  PointerBuilder::initStruct(&local_168,(PointerBuilder *)&local_188,(StructSize)0x140006);
  AVar6 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  pwVar3 = (AVar6.ptr)->ptr;
  sVar2 = (AVar6.ptr)->size_;
  local_188.capTable = (CapTableBuilder *)(local_168.pointers + 1);
  local_188.tag.content = (uint64_t)local_168.segment;
  local_188.segment = (SegmentBuilder *)local_168.capTable;
  value.super_ArrayPtr<const_unsigned_char>.size_ = 7;
  value.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)"abcd123";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)&local_188,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  pwVar4 = (AVar6.ptr)->ptr + (AVar6.ptr)->size_;
  local_188.tag.content = (uint64_t)local_168.segment;
  local_188.segment = (SegmentBuilder *)local_168.capTable;
  local_188.capTable = (CapTableBuilder *)local_168.pointers;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_188,value_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((AVar6.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.segment = (SegmentBuilder *)CONCAT44(local_1a8.segment._4_4_,1);
    AVar6 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.tag.content = AVar6.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1a8,(unsigned_long *)&local_188);
  }
  local_1a8.pointer = local_168.pointers + 1;
  local_1a8.segment = local_168.segment;
  local_1a8.capTable = local_168.capTable;
  PointerBuilder::disown(&local_188,&local_1a8);
  local_138.segment = local_188.segment;
  local_138.capTable = local_188.capTable;
  local_138.location = local_188.location;
  local_138.tag.content = local_188.tag.content;
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_138);
  }
  pwVar1 = pwVar3 + sVar2;
  if (pwVar1 < pwVar4) {
    if ((char)pwVar1->content == '\0') {
      pwVar3 = pwVar3 + sVar2;
      do {
        pwVar3 = (word *)((long)&pwVar3->content + 1);
        if (pwVar3 == pwVar4) break;
      } while ((char)pwVar3->content == '\0');
      bVar5 = pwVar4 <= pwVar3;
    }
    else {
      bVar5 = false;
    }
    if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x327,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
    }
  }
  local_188.tag.content = (uint64_t)local_168.segment;
  local_188.segment = (SegmentBuilder *)local_168.capTable;
  local_188.capTable = (CapTableBuilder *)local_168.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1a8,(PointerBuilder *)&local_188,(void *)0x0,0);
  if (((local_1a8.pointer != (WirePointer *)0x4) ||
      (*(char *)((long)&((SegmentReader *)&(local_1a8.capTable)->super_CapTableReader)->arena + 2)
       != 'o' || *(short *)&((SegmentReader *)&(local_1a8.capTable)->super_CapTableReader)->arena !=
                 0x6f66)) && (kj::_::Debug::minSeverity < 3)) {
    local_188.tag.content = (uint64_t)local_168.segment;
    local_188.segment = (SegmentBuilder *)local_168.capTable;
    local_188.capTable = (CapTableBuilder *)local_168.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1a8,(PointerBuilder *)&local_188,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x329,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",(Builder *)&local_1a8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Orphans, DataZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setDataField(data("abcd123"));
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownDataField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}